

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramStateQueryTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::TessellationShaderCase::iterate
          (TessellationShaderCase *this)

{
  pointer pcVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  TestLog *pTVar4;
  Context *pCVar5;
  RenderContext *pRVar6;
  bool bVar7;
  ContextType ctxType;
  int iVar8;
  undefined4 extraout_var;
  TestError *pTVar9;
  NotSupportedError *this_00;
  string *psVar10;
  long lVar11;
  ScopedLogSection section;
  CallLogWrapper gl;
  ResultCollector result;
  ShaderProgram program;
  ScopedLogSection local_360;
  CallLogWrapper local_358;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  uint local_2c0;
  value_type local_2b8;
  uint local_298;
  value_type local_290;
  uint local_270;
  value_type local_268;
  uint local_248;
  value_type local_240;
  ResultCollector local_220;
  undefined1 local_1d0 [152];
  GLuint local_138;
  bool local_110;
  undefined1 local_100 [144];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_70;
  undefined1 local_50 [32];
  
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar7 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (!bVar7) {
    bVar7 = glu::ContextInfo::isExtensionSupported
                      (((this->super_TestCase).m_context)->m_contextInfo,
                       "GL_EXT_tessellation_shader");
    if (!bVar7) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_00,
                 "Tessellation shader tests require GL_EXT_tessellation_shader extension or an OpenGL ES 3.2 or higher context."
                 ,(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramStateQueryTests.cpp"
                 ,0xde);
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  iVar8 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&local_358,(Functions *)CONCAT44(extraout_var,iVar8),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  pTVar4 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  pcVar1 = local_1d0 + 0x10;
  local_1d0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0," // ERROR: ","");
  tcu::ResultCollector::ResultCollector(&local_220,pTVar4,(string *)local_1d0);
  if ((pointer)local_1d0._0_8_ != pcVar1) {
    operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
  }
  local_358.m_enableLog = true;
  pTVar4 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_1d0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"Query State","");
  pcVar2 = local_100 + 0x10;
  local_100._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_100,"3 vertices, triangles, equal_spacing, cw","");
  psVar10 = (string *)local_100;
  tcu::ScopedLogSection::ScopedLogSection(&local_360,pTVar4,(string *)local_1d0,psVar10);
  if ((pointer)local_100._0_8_ != pcVar2) {
    operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
  }
  if ((pointer)local_1d0._0_8_ != pcVar1) {
    operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
  }
  pCVar5 = (this->super_TestCase).m_context;
  pRVar6 = pCVar5->m_renderCtx;
  local_50[0x10] = 0;
  local_50._17_8_ = 0;
  local_50._0_8_ = (pointer)0x0;
  local_50[8] = 0;
  local_50._9_7_ = 0;
  memset(local_100,0,0xac);
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_2e0,(_anonymous_namespace_ *)pCVar5,
             (Context *)"${GLSL_VERSION_DECL}\nvoid main()\n{\n}\n",(char *)psVar10);
  local_270 = 0;
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_268,local_2e0._M_dataplus._M_p,
             local_2e0._M_dataplus._M_p + local_2e0._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_100 + (ulong)local_270 * 0x18),&local_268);
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_300,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
             (Context *)"${GLSL_VERSION_DECL}\nvoid main()\n{\n}\n",(char *)psVar10);
  local_298 = 1;
  local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_290,local_300._M_dataplus._M_p,
             local_300._M_dataplus._M_p + local_300._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_100 + (ulong)local_298 * 0x18),&local_290);
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_320,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
             (Context *)
             "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\nlayout(vertices = 3) out;\nvoid main()\n{\n}\n"
             ,(char *)psVar10);
  local_2c0 = 3;
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2b8,local_320._M_dataplus._M_p,
             local_320._M_dataplus._M_p + local_320._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_100 + (ulong)local_2c0 * 0x18),&local_2b8);
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_340,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
             (Context *)
             "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\nlayout(triangles, equal_spacing, cw) in;\nvoid main()\n{\n}\n"
             ,(char *)psVar10);
  local_248 = 4;
  paVar3 = &local_240.field_2;
  local_240._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_240,local_340._M_dataplus._M_p,
             local_340._M_dataplus._M_p + local_340._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_100 + (ulong)local_248 * 0x18),&local_240);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_1d0,pRVar6,(ProgramSources *)local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != paVar3) {
    operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_dataplus._M_p != &local_340.field_2) {
    operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != &local_320.field_2) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != &local_300.field_2) {
    operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_50);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_70);
  lVar11 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_100 + lVar11));
    lVar11 = lVar11 + -0x18;
  } while (lVar11 != -0x18);
  if (local_110 != false) {
    glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                    (ShaderProgram *)local_1d0);
    gls::StateQueryUtil::verifyStateProgramInteger
              (&local_220,&local_358,local_138,0x8e75,3,this->m_verifier);
    gls::StateQueryUtil::verifyStateProgramInteger
              (&local_220,&local_358,local_138,0x8e76,4,this->m_verifier);
    gls::StateQueryUtil::verifyStateProgramInteger
              (&local_220,&local_358,local_138,0x8e77,0x202,this->m_verifier);
    gls::StateQueryUtil::verifyStateProgramInteger
              (&local_220,&local_358,local_138,0x8e78,0x900,this->m_verifier);
    gls::StateQueryUtil::verifyStateProgramInteger
              (&local_220,&local_358,local_138,0x8e79,0,this->m_verifier);
    glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_1d0);
    tcu::TestLog::endSection(local_360.m_log);
    pTVar4 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    local_1d0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"Query State","");
    local_100._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_100,"5 vertices, quads, fractional_even_spacing, ccw","");
    psVar10 = (string *)local_100;
    tcu::ScopedLogSection::ScopedLogSection(&local_360,pTVar4,(string *)local_1d0,psVar10);
    if ((pointer)local_100._0_8_ != pcVar2) {
      operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
    }
    if ((pointer)local_1d0._0_8_ != pcVar1) {
      operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
    }
    pCVar5 = (this->super_TestCase).m_context;
    pRVar6 = pCVar5->m_renderCtx;
    local_50[0x10] = 0;
    local_50._17_8_ = 0;
    local_50._0_8_ = (pointer)0x0;
    local_50[8] = 0;
    local_50._9_7_ = 0;
    memset(local_100,0,0xac);
    (anonymous_namespace)::specializeShader_abi_cxx11_
              (&local_2e0,(_anonymous_namespace_ *)pCVar5,
               (Context *)"${GLSL_VERSION_DECL}\nvoid main()\n{\n}\n",(char *)psVar10);
    local_270 = 0;
    local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_268,local_2e0._M_dataplus._M_p,
               local_2e0._M_dataplus._M_p + local_2e0._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_100 + (ulong)local_270 * 0x18),&local_268);
    (anonymous_namespace)::specializeShader_abi_cxx11_
              (&local_300,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
               (Context *)"${GLSL_VERSION_DECL}\nvoid main()\n{\n}\n",(char *)psVar10);
    local_298 = 1;
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_290,local_300._M_dataplus._M_p,
               local_300._M_dataplus._M_p + local_300._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_100 + (ulong)local_298 * 0x18),&local_290);
    (anonymous_namespace)::specializeShader_abi_cxx11_
              (&local_320,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
               (Context *)
               "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\nlayout(vertices = 5) out;\nvoid main()\n{\n}\n"
               ,(char *)psVar10);
    local_2c0 = 3;
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2b8,local_320._M_dataplus._M_p,
               local_320._M_dataplus._M_p + local_320._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_100 + (ulong)local_2c0 * 0x18),&local_2b8);
    (anonymous_namespace)::specializeShader_abi_cxx11_
              (&local_340,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
               (Context *)
               "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\nlayout(quads, fractional_even_spacing, ccw) in;\nvoid main()\n{\n}\n"
               ,(char *)psVar10);
    local_248 = 4;
    local_240._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_240,local_340._M_dataplus._M_p,
               local_340._M_dataplus._M_p + local_340._M_string_length);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_100 + (ulong)local_248 * 0x18),&local_240);
    glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_1d0,pRVar6,(ProgramSources *)local_100)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != paVar3) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_340._M_dataplus._M_p != &local_340.field_2) {
      operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != &local_320.field_2) {
      operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != &local_300.field_2) {
      operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
      operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_50);
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
              (&local_70);
    lVar11 = 0x78;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_100 + lVar11));
      lVar11 = lVar11 + -0x18;
    } while (lVar11 != -0x18);
    if (local_110 != false) {
      glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                      (ShaderProgram *)local_1d0);
      gls::StateQueryUtil::verifyStateProgramInteger
                (&local_220,&local_358,local_138,0x8e75,5,this->m_verifier);
      gls::StateQueryUtil::verifyStateProgramInteger
                (&local_220,&local_358,local_138,0x8e76,7,this->m_verifier);
      gls::StateQueryUtil::verifyStateProgramInteger
                (&local_220,&local_358,local_138,0x8e77,0x8e7c,this->m_verifier);
      gls::StateQueryUtil::verifyStateProgramInteger
                (&local_220,&local_358,local_138,0x8e78,0x901,this->m_verifier);
      gls::StateQueryUtil::verifyStateProgramInteger
                (&local_220,&local_358,local_138,0x8e79,0,this->m_verifier);
      glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_1d0);
      tcu::TestLog::endSection(local_360.m_log);
      pTVar4 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      local_1d0._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"Query State","");
      local_100._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_100,"5 vertices, isolines, fractional_odd_spacing, ccw, point_mode"
                 ,"");
      psVar10 = (string *)local_100;
      tcu::ScopedLogSection::ScopedLogSection(&local_360,pTVar4,(string *)local_1d0,psVar10);
      if ((pointer)local_100._0_8_ != pcVar2) {
        operator_delete((void *)local_100._0_8_,local_100._16_8_ + 1);
      }
      if ((pointer)local_1d0._0_8_ != pcVar1) {
        operator_delete((void *)local_1d0._0_8_,local_1d0._16_8_ + 1);
      }
      pCVar5 = (this->super_TestCase).m_context;
      pRVar6 = pCVar5->m_renderCtx;
      local_50[0x10] = 0;
      local_50._17_8_ = 0;
      local_50._0_8_ = (pointer)0x0;
      local_50[8] = 0;
      local_50._9_7_ = 0;
      memset(local_100,0,0xac);
      (anonymous_namespace)::specializeShader_abi_cxx11_
                (&local_2e0,(_anonymous_namespace_ *)pCVar5,
                 (Context *)"${GLSL_VERSION_DECL}\nvoid main()\n{\n}\n",(char *)psVar10);
      local_270 = 0;
      local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_268,local_2e0._M_dataplus._M_p,
                 local_2e0._M_dataplus._M_p + local_2e0._M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_100 + (ulong)local_270 * 0x18),&local_268);
      (anonymous_namespace)::specializeShader_abi_cxx11_
                (&local_300,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
                 (Context *)"${GLSL_VERSION_DECL}\nvoid main()\n{\n}\n",(char *)psVar10);
      local_298 = 1;
      local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_290,local_300._M_dataplus._M_p,
                 local_300._M_dataplus._M_p + local_300._M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_100 + (ulong)local_298 * 0x18),&local_290);
      (anonymous_namespace)::specializeShader_abi_cxx11_
                (&local_320,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
                 (Context *)
                 "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\nlayout(vertices = 5) out;\nvoid main()\n{\n}\n"
                 ,(char *)psVar10);
      local_2c0 = 3;
      local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2b8,local_320._M_dataplus._M_p,
                 local_320._M_dataplus._M_p + local_320._M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_100 + (ulong)local_2c0 * 0x18),&local_2b8);
      (anonymous_namespace)::specializeShader_abi_cxx11_
                (&local_340,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
                 (Context *)
                 "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\nlayout(isolines, fractional_odd_spacing, ccw, point_mode) in;\nvoid main()\n{\n}\n"
                 ,(char *)psVar10);
      local_248 = 4;
      local_240._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_240,local_340._M_dataplus._M_p,
                 local_340._M_dataplus._M_p + local_340._M_string_length);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_100 + (ulong)local_248 * 0x18),&local_240);
      glu::ShaderProgram::ShaderProgram
                ((ShaderProgram *)local_1d0,pRVar6,(ProgramSources *)local_100);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != paVar3) {
        operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_340._M_dataplus._M_p != &local_340.field_2) {
        operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_320._M_dataplus._M_p != &local_320.field_2) {
        operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300._M_dataplus._M_p != &local_300.field_2) {
        operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
        operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
        operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_50);
      std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
                (&local_70);
      lVar11 = 0x78;
      do {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_100 + lVar11));
        lVar11 = lVar11 + -0x18;
      } while (lVar11 != -0x18);
      if (local_110 != false) {
        glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                        (ShaderProgram *)local_1d0);
        gls::StateQueryUtil::verifyStateProgramInteger
                  (&local_220,&local_358,local_138,0x8e75,5,this->m_verifier);
        gls::StateQueryUtil::verifyStateProgramInteger
                  (&local_220,&local_358,local_138,0x8e76,0x8e7a,this->m_verifier);
        gls::StateQueryUtil::verifyStateProgramInteger
                  (&local_220,&local_358,local_138,0x8e77,0x8e7b,this->m_verifier);
        gls::StateQueryUtil::verifyStateProgramInteger
                  (&local_220,&local_358,local_138,0x8e78,0x901,this->m_verifier);
        gls::StateQueryUtil::verifyStateProgramInteger
                  (&local_220,&local_358,local_138,0x8e79,1,this->m_verifier);
        glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_1d0);
        tcu::TestLog::endSection(local_360.m_log);
        tcu::ResultCollector::setTestContextResult
                  (&local_220,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220.m_message._M_dataplus._M_p != &local_220.m_message.field_2) {
          operator_delete(local_220.m_message._M_dataplus._M_p,
                          local_220.m_message.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220.m_prefix._M_dataplus._M_p != &local_220.m_prefix.field_2) {
          operator_delete(local_220.m_prefix._M_dataplus._M_p,
                          local_220.m_prefix.field_2._M_allocated_capacity + 1);
        }
        glu::CallLogWrapper::~CallLogWrapper(&local_358);
        return STOP;
      }
      pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar9,"Compile failed","program.isOk()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramStateQueryTests.cpp"
                 ,0x13c);
      __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar9,"Compile failed","program.isOk()",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramStateQueryTests.cpp"
               ,0x129);
    __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar9,"Compile failed","program.isOk()",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramStateQueryTests.cpp"
             ,0x116);
  __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

TessellationShaderCase::IterateResult TessellationShaderCase::iterate (void)
{
	const bool supportsES32 = glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	if (!supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_EXT_tessellation_shader"))
		TCU_THROW(NotSupportedError, "Tessellation shader tests require GL_EXT_tessellation_shader extension or an OpenGL ES 3.2 or higher context.");


	static const char* const	s_vtxFragTemplate	=	"${GLSL_VERSION_DECL}\n"
														"void main()\n"
														"{\n"
														"}\n";

	static const char* const	s_tessCtrlTemplate1	=	"${GLSL_VERSION_DECL}\n"
														"${TESSELLATION_SHADER_REQUIRE}\n"
														"layout(vertices = 3) out;\n"
														"void main()\n"
														"{\n"
														"}\n";

	static const char* const	s_tessEvalTemplate1	=	"${GLSL_VERSION_DECL}\n"
														"${TESSELLATION_SHADER_REQUIRE}\n"
														"layout(triangles, equal_spacing, cw) in;\n"
														"void main()\n"
														"{\n"
														"}\n";

	static const char* const	s_tessCtrlTemplate2	=	"${GLSL_VERSION_DECL}\n"
														"${TESSELLATION_SHADER_REQUIRE}\n"
														"layout(vertices = 5) out;\n"
														"void main()\n"
														"{\n"
														"}\n";

	static const char* const	s_tessEvalTemplate2	=	"${GLSL_VERSION_DECL}\n"
														"${TESSELLATION_SHADER_REQUIRE}\n"
														"layout(quads, fractional_even_spacing, ccw) in;\n"
														"void main()\n"
														"{\n"
														"}\n";

	static const char* const	s_tessEvalTemplate3	=	"${GLSL_VERSION_DECL}\n"
														"${TESSELLATION_SHADER_REQUIRE}\n"
														"layout(isolines, fractional_odd_spacing, ccw, point_mode) in;\n"
														"void main()\n"
														"{\n"
														"}\n";

	glu::CallLogWrapper			gl						(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector		result					(m_testCtx.getLog(), " // ERROR: ");

	gl.enableLogging(true);

	{
		const tcu::ScopedLogSection	section		(m_testCtx.getLog(), "Query State", "3 vertices, triangles, equal_spacing, cw");
		glu::ShaderProgram			program		(m_context.getRenderContext(), glu::ProgramSources()
			<< glu::VertexSource(specializeShader(m_context, s_vtxFragTemplate))
			<< glu::FragmentSource(specializeShader(m_context, s_vtxFragTemplate))
			<< glu::TessellationControlSource(specializeShader(m_context, s_tessCtrlTemplate1))
			<< glu::TessellationEvaluationSource(specializeShader(m_context, s_tessEvalTemplate1)));

		TCU_CHECK_MSG(program.isOk(), "Compile failed");

		m_testCtx.getLog() << program;

		verifyStateProgramInteger(result, gl, program.getProgram(), GL_TESS_CONTROL_OUTPUT_VERTICES, 3, m_verifier);
		verifyStateProgramInteger(result, gl, program.getProgram(), GL_TESS_GEN_MODE, GL_TRIANGLES, m_verifier);
		verifyStateProgramInteger(result, gl, program.getProgram(), GL_TESS_GEN_SPACING, GL_EQUAL, m_verifier);
		verifyStateProgramInteger(result, gl, program.getProgram(), GL_TESS_GEN_VERTEX_ORDER, GL_CW, m_verifier);
		verifyStateProgramInteger(result, gl, program.getProgram(), GL_TESS_GEN_POINT_MODE, GL_FALSE, m_verifier);
	}

	{
		const tcu::ScopedLogSection	section		(m_testCtx.getLog(), "Query State", "5 vertices, quads, fractional_even_spacing, ccw");
		glu::ShaderProgram			program		(m_context.getRenderContext(), glu::ProgramSources()
			<< glu::VertexSource(specializeShader(m_context, s_vtxFragTemplate))
			<< glu::FragmentSource(specializeShader(m_context, s_vtxFragTemplate))
			<< glu::TessellationControlSource(specializeShader(m_context, s_tessCtrlTemplate2))
			<< glu::TessellationEvaluationSource(specializeShader(m_context, s_tessEvalTemplate2)));

		TCU_CHECK_MSG(program.isOk(), "Compile failed");

		m_testCtx.getLog() << program;

		verifyStateProgramInteger(result, gl, program.getProgram(), GL_TESS_CONTROL_OUTPUT_VERTICES, 5, m_verifier);
		verifyStateProgramInteger(result, gl, program.getProgram(), GL_TESS_GEN_MODE, GL_QUADS, m_verifier);
		verifyStateProgramInteger(result, gl, program.getProgram(), GL_TESS_GEN_SPACING, GL_FRACTIONAL_EVEN, m_verifier);
		verifyStateProgramInteger(result, gl, program.getProgram(), GL_TESS_GEN_VERTEX_ORDER, GL_CCW, m_verifier);
		verifyStateProgramInteger(result, gl, program.getProgram(), GL_TESS_GEN_POINT_MODE, GL_FALSE, m_verifier);
	}

	{
		const tcu::ScopedLogSection	section		(m_testCtx.getLog(), "Query State", "5 vertices, isolines, fractional_odd_spacing, ccw, point_mode");
		glu::ShaderProgram			program		(m_context.getRenderContext(), glu::ProgramSources()
			<< glu::VertexSource(specializeShader(m_context, s_vtxFragTemplate))
			<< glu::FragmentSource(specializeShader(m_context, s_vtxFragTemplate))
			<< glu::TessellationControlSource(specializeShader(m_context, s_tessCtrlTemplate2))
			<< glu::TessellationEvaluationSource(specializeShader(m_context, s_tessEvalTemplate3)));

		TCU_CHECK_MSG(program.isOk(), "Compile failed");

		m_testCtx.getLog() << program;

		verifyStateProgramInteger(result, gl, program.getProgram(), GL_TESS_CONTROL_OUTPUT_VERTICES, 5, m_verifier);
		verifyStateProgramInteger(result, gl, program.getProgram(), GL_TESS_GEN_MODE, GL_ISOLINES, m_verifier);
		verifyStateProgramInteger(result, gl, program.getProgram(), GL_TESS_GEN_SPACING, GL_FRACTIONAL_ODD, m_verifier);
		verifyStateProgramInteger(result, gl, program.getProgram(), GL_TESS_GEN_VERTEX_ORDER, GL_CCW, m_verifier);
		verifyStateProgramInteger(result, gl, program.getProgram(), GL_TESS_GEN_POINT_MODE, GL_TRUE, m_verifier);
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}